

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

int nghttp2_hd_deflate_hd_bufs
              (nghttp2_hd_deflater *deflater,nghttp2_bufs *bufs,nghttp2_nv *nv,size_t nvlen)

{
  nghttp2_nv *pnVar1;
  uint8_t *name;
  size_t namelen;
  nghttp2_rcbuf *pnVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  uint32_t hash;
  ulong uVar7;
  nghttp2_hd_entry *pnVar8;
  nghttp2_hd_entry *pnVar9;
  ulong uVar10;
  ulong uVar11;
  nghttp2_hd_entry *pnVar12;
  uint8_t **ppuVar13;
  bool bVar14;
  bool bVar15;
  nghttp2_hd_nv hd_nv;
  uint local_b8;
  nghttp2_hd_nv local_88;
  ulong local_70;
  nghttp2_hd_map *local_68;
  nghttp2_mem *local_60;
  nghttp2_nv *local_58;
  size_t local_50;
  nghttp2_hd_nv local_48;
  
  iVar3 = -0x20b;
  if ((deflater->ctx).bad == '\0') {
    if (deflater->notify_table_size_change != '\0') {
      uVar10 = deflater->min_hd_table_bufsize_max;
      deflater->notify_table_size_change = '\0';
      deflater->min_hd_table_bufsize_max = 0xffffffff;
      if ((uVar10 < (deflater->ctx).hd_table_bufsize_max) &&
         (iVar3 = emit_table_size(bufs,uVar10), iVar3 != 0)) {
        bVar15 = false;
      }
      else {
        iVar3 = emit_table_size(bufs,(deflater->ctx).hd_table_bufsize_max);
        bVar15 = iVar3 == 0;
      }
      if (!bVar15) {
LAB_0016d031:
        (deflater->ctx).bad = '\x01';
        return iVar3;
      }
    }
    if (nvlen != 0) {
      local_68 = &deflater->map;
      sVar6 = 0;
      local_58 = nv;
      do {
        pnVar1 = local_58;
        local_60 = (deflater->ctx).mem;
        name = local_58[sVar6].name;
        namelen = local_58[sVar6].namelen;
        local_50 = sVar6;
        uVar4 = lookup_token(name,namelen);
        if (uVar4 == 0xffffffff) {
          hash = 0x811c9dc5;
          if (namelen != 0) {
            sVar5 = 0;
            do {
              hash = (name[sVar5] ^ hash) * 0x1000193;
              sVar5 = sVar5 + 1;
            } while (namelen != sVar5);
          }
        }
        else {
          hash = 0;
          if ((int)uVar4 < 0x3d) {
            hash = static_table[(int)uVar4].hash;
          }
        }
        pnVar1 = pnVar1 + sVar6;
        local_b8 = 2;
        if ((uVar4 != 0x16) &&
           ((((uVar4 != 0x1f || (0x13 < pnVar1->valuelen)) && ((pnVar1->flags & 1) == 0)) &&
            ((0x36 < uVar4 || (local_b8 = 1, (0x40218208100008U >> ((ulong)uVar4 & 0x3f) & 1) == 0))
            )))) {
          local_b8 = (uint)((deflater->ctx).hd_table_bufsize_max * 3 >> 2 <
                           pnVar1->valuelen + namelen + 0x20);
        }
        pnVar8 = local_68->table[hash & 0x7f];
        bVar15 = true;
        if (pnVar8 == (nghttp2_hd_entry *)0x0) {
          pnVar9 = (nghttp2_hd_entry *)0x0;
        }
        else {
          pnVar9 = (nghttp2_hd_entry *)0x0;
          do {
            if (((pnVar8->nv).token == uVar4) &&
               ((uVar4 != 0xffffffff ||
                (((pnVar8->hash == hash && (pnVar2 = (pnVar8->nv).name, pnVar2->len == namelen)) &&
                 (iVar3 = bcmp(pnVar2->base,name,namelen), iVar3 == 0)))))) {
              pnVar12 = pnVar9;
              if (pnVar9 == (nghttp2_hd_entry *)0x0) {
                pnVar12 = pnVar8;
              }
              if ((local_b8 == 2) &&
                 (bVar14 = pnVar9 == (nghttp2_hd_entry *)0x0, pnVar9 = pnVar8, bVar14)) break;
              pnVar2 = (pnVar8->nv).value;
              pnVar9 = pnVar12;
              if ((pnVar2->len == pnVar1->valuelen) &&
                 (iVar3 = bcmp(pnVar2->base,pnVar1->value,pnVar1->valuelen), iVar3 == 0)) {
                bVar15 = false;
                pnVar9 = pnVar8;
                break;
              }
            }
            pnVar8 = pnVar8->next;
          } while (pnVar8 != (nghttp2_hd_entry *)0x0);
        }
        if (bVar15 && uVar4 < 0x3d) {
          uVar10 = (ulong)uVar4;
          bVar15 = true;
          if (local_b8 != 2) {
            ppuVar13 = &static_table[uVar10].value.base;
            uVar7 = uVar10;
            local_70 = uVar10;
            do {
              uVar10 = local_70;
              if (*(uint *)(ppuVar13 + 8) != uVar4) break;
              if ((ppuVar13[1] == (uint8_t *)pnVar1->valuelen) &&
                 (iVar3 = bcmp(*ppuVar13,pnVar1->value,pnVar1->valuelen), iVar3 == 0)) {
                bVar15 = false;
                uVar10 = uVar7;
                break;
              }
              iVar3 = (int)uVar7;
              ppuVar13 = ppuVar13 + 0x10;
              uVar7 = uVar7 + 1;
              uVar10 = local_70;
            } while (iVar3 < 0x3c);
          }
        }
        else if (pnVar9 == (nghttp2_hd_entry *)0x0) {
          bVar15 = true;
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = (ulong)((deflater->ctx).next_seq + ~pnVar9->seq + 0x3d);
        }
        if (bVar15) {
          if (local_b8 == 0) {
            if (uVar10 == 0xffffffffffffffff) {
              iVar3 = nghttp2_rcbuf_new2(&local_88.name,name,namelen,local_60);
              if (iVar3 == 0) goto LAB_0016ceaa;
LAB_0016cf6c:
              bVar15 = false;
            }
            else {
              nghttp2_hd_table_get(&local_48,&deflater->ctx,uVar10);
              local_88.name = local_48.name;
              nghttp2_rcbuf_incref(local_48.name);
LAB_0016ceaa:
              iVar3 = nghttp2_rcbuf_new2(&local_88.value,pnVar1->value,pnVar1->valuelen,local_60);
              if (iVar3 != 0) {
                nghttp2_rcbuf_decref(local_88.name);
                goto LAB_0016cf6c;
              }
              local_88.flags = '\0';
              local_88.token = uVar4;
              iVar3 = add_hd_table_incremental(&deflater->ctx,&local_88,local_68,hash);
              nghttp2_rcbuf_decref(local_88.value);
              nghttp2_rcbuf_decref(local_88.name);
              bVar15 = iVar3 == 0;
              iVar3 = -0x20b;
            }
            if (!bVar15) goto LAB_0016cfe3;
          }
          if (uVar10 == 0xffffffffffffffff) {
            iVar3 = emit_newname_block(bufs,pnVar1,local_b8);
          }
          else {
            iVar3 = emit_indname_block(bufs,uVar10,pnVar1,local_b8);
          }
        }
        else {
          uVar7 = 1;
          if (0x7e < uVar10 + 1) {
            uVar11 = uVar10 - 0x7e;
            uVar7 = 2;
            if (0x7f < uVar11) {
              do {
                uVar7 = uVar7 + 1;
                bVar15 = 0x3fff < uVar11;
                uVar11 = uVar11 >> 7;
              } while (bVar15);
            }
          }
          iVar3 = -0x20b;
          if (uVar7 < 0x11) {
            local_88.name = (nghttp2_rcbuf *)CONCAT71(local_88.name._1_7_,0x80);
            encode_length((uint8_t *)&local_88,uVar10 + 1,7);
            iVar3 = nghttp2_bufs_add(bufs,&local_88,uVar7);
          }
        }
LAB_0016cfe3:
        if (iVar3 != 0) goto LAB_0016d031;
        sVar6 = local_50 + 1;
      } while (sVar6 != nvlen);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int nghttp2_hd_deflate_hd_bufs(nghttp2_hd_deflater *deflater,
                               nghttp2_bufs *bufs, const nghttp2_nv *nv,
                               size_t nvlen) {
  size_t i;
  int rv = 0;

  if (deflater->ctx.bad) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  if (deflater->notify_table_size_change) {
    size_t min_hd_table_bufsize_max;

    min_hd_table_bufsize_max = deflater->min_hd_table_bufsize_max;

    deflater->notify_table_size_change = 0;
    deflater->min_hd_table_bufsize_max = UINT32_MAX;

    if (deflater->ctx.hd_table_bufsize_max > min_hd_table_bufsize_max) {

      rv = emit_table_size(bufs, min_hd_table_bufsize_max);

      if (rv != 0) {
        goto fail;
      }
    }

    rv = emit_table_size(bufs, deflater->ctx.hd_table_bufsize_max);

    if (rv != 0) {
      goto fail;
    }
  }

  for (i = 0; i < nvlen; ++i) {
    rv = deflate_nv(deflater, bufs, &nv[i]);
    if (rv != 0) {
      goto fail;
    }
  }

  DEBUGF("deflatehd: all input name/value pairs were deflated\n");

  return 0;
fail:
  DEBUGF("deflatehd: error return %d\n", rv);

  deflater->ctx.bad = 1;
  return rv;
}